

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall LLVMBC::LLVMContext::allocate_new_chain(LLVMContext *this,size_t size,size_t align)

{
  size_t size_00;
  uintptr_t uVar1;
  void *ptr;
  void *local_20;
  
  size_00 = 0x10000;
  if (0x10000 < size + align) {
    size_00 = size + align;
  }
  local_20 = dxil_spv::allocate_in_thread(size_00);
  if (local_20 == (void *)0x0) {
    local_20 = (void *)0x0;
    uVar1 = 0;
  }
  else {
    std::vector<void_*,_dxil_spv::ThreadLocalAllocator<void_*>_>::push_back
              (&this->raw_allocations,&local_20);
    uVar1 = size_00 + (long)local_20;
  }
  this->current_block = (uintptr_t)local_20;
  this->current_block_end = uVar1;
  return;
}

Assistant:

void LLVMContext::allocate_new_chain(size_t size, size_t align)
{
	size_t min_size = size + align;
	if (min_size < 64 * 1024)
		min_size = 64 * 1024;

	void *ptr = dxil_spv::allocate_in_thread(min_size);
	if (ptr)
	{
		raw_allocations.push_back(ptr);
		current_block = reinterpret_cast<uintptr_t>(ptr);
		current_block_end = current_block + min_size;
	}
	else
	{
		current_block = 0;
		current_block_end = 0;
	}
}